

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O2

ItemFlags __thiscall QtPrivate::QCalendarModel::flags(QCalendarModel *this,QModelIndex *index)

{
  QFlagsStorageHelper<Qt::ItemFlag,_4> QVar1;
  QDate QVar2;
  
  QVar2 = dateForCell(this,index->r,index->c);
  if ((QVar2.jd + 0xb69eeff91fU < 0x16d3e147974) &&
     ((QVar2.jd < (this->m_minimumDate).jd || ((this->m_maximumDate).jd < QVar2.jd)))) {
    return (QFlagsStorageHelper<Qt::ItemFlag,_4>)(QFlagsStorage<Qt::ItemFlag>)0x0;
  }
  QVar1.super_QFlagsStorage<Qt::ItemFlag>.i =
       (QFlagsStorage<Qt::ItemFlag>)QAbstractTableModel::flags((QModelIndex *)this);
  return (QFlagsStorageHelper<Qt::ItemFlag,_4>)
         (QFlagsStorageHelper<Qt::ItemFlag,_4>)QVar1.super_QFlagsStorage<Qt::ItemFlag>.i;
}

Assistant:

Qt::ItemFlags QCalendarModel::flags(const QModelIndex &index) const
{
    QDate date = dateForCell(index.row(), index.column());
    if (!date.isValid())
        return QAbstractTableModel::flags(index);
    if (date < m_minimumDate)
        return { };
    if (date > m_maximumDate)
        return { };
    return QAbstractTableModel::flags(index);
}